

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QModelIndexList * __thiscall
QListView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QListView *this)

{
  QModelIndex *pQVar1;
  quintptr qVar2;
  QAbstractItemModel *pQVar3;
  int iVar4;
  undefined4 uVar5;
  quintptr qVar6;
  bool bVar7;
  char cVar8;
  long lVar9;
  iterator aend;
  iterator iVar10;
  long lVar11;
  const_iterator __it;
  const_iterator cVar12;
  QModelIndex *pQVar13;
  long in_FS_OFFSET;
  const_iterator local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = *(quintptr *)
           &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
            field_0x8;
  if (((*(long *)(qVar2 + 800) == 0) || (*(int *)(*(long *)(qVar2 + 800) + 4) == 0)) ||
     (*(long *)(qVar2 + 0x328) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_005799b9;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selectedIndexes();
  pQVar13 = (__return_storage_ptr__->d).ptr;
  lVar9 = (__return_storage_ptr__->d).size;
  lVar11 = lVar9 >> 2;
  __it.i = pQVar13;
  local_50._0_8_ = this;
  local_50.i = qVar2;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it);
      cVar12.i = __it.i;
      if (bVar7) goto LAB_005798a8;
      bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it.i + 1)
      ;
      cVar12.i = __it.i + 1;
      if (bVar7) goto LAB_005798a8;
      bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it.i + 2)
      ;
      cVar12.i = __it.i + 2;
      if (bVar7) goto LAB_005798a8;
      bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                        ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it.i + 3)
      ;
      cVar12.i = __it.i + 3;
      if (bVar7) goto LAB_005798a8;
      __it.i = __it.i + 4;
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  pQVar1 = pQVar13 + lVar9;
  lVar9 = ((long)pQVar1 - (long)__it.i >> 3) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_00579895:
    bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                      ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it);
    cVar12.i = pQVar1;
    if (bVar7) {
      cVar12.i = __it.i;
    }
  }
  else if (lVar9 == 2) {
LAB_00579845:
    bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                      ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it);
    cVar12.i = __it.i;
    if (!bVar7) {
      __it.i = __it.i + 1;
      goto LAB_00579895;
    }
  }
  else {
    cVar12.i = pQVar1;
    if ((lVar9 == 3) &&
       (bVar7 = __gnu_cxx::__ops::_Iter_pred<QListView::selectedIndexes()const::$_0>::operator()
                          ((_Iter_pred<QListView::selectedIndexes()const::__0> *)&local_50,__it),
       cVar12.i = __it.i, !bVar7)) {
      __it.i = __it.i + 1;
      goto LAB_00579845;
    }
  }
LAB_005798a8:
  lVar9 = (long)cVar12.i - (long)pQVar13;
  if ((lVar9 >> 3) * -0x5555555555555555 - (__return_storage_ptr__->d).size != 0) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar10 = QList<QModelIndex>::begin(__return_storage_ptr__);
    local_68.i = iVar10.i + lVar9;
    pQVar13 = iVar10.i + lVar9 + 0x18;
    if (pQVar13 != aend.i) {
      do {
        if (pQVar13->c == *(int *)(qVar2 + 0x590)) {
          pQVar3 = (pQVar13->m).ptr;
          if (pQVar3 == (QAbstractItemModel *)0x0) {
            local_50._0_8_ = (QListView *)0xffffffffffffffff;
            local_50.i = 0;
            local_50.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)pQVar3 + 0x68))(&local_50,pQVar3,pQVar13);
          }
          cVar8 = comparesEqual((QPersistentModelIndex *)(qVar2 + 0x3b8),&local_50);
          if ((cVar8 != '\0') &&
             (cVar8 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                  0x2c0))(this,pQVar13), cVar8 == '\0')) {
            ((local_68.i)->m).ptr = (pQVar13->m).ptr;
            iVar4 = pQVar13->c;
            qVar6 = pQVar13->i;
            uVar5 = *(undefined4 *)((long)&pQVar13->i + 4);
            (local_68.i)->r = pQVar13->r;
            (local_68.i)->c = iVar4;
            *(int *)&(local_68.i)->i = (int)qVar6;
            *(undefined4 *)((long)&(local_68.i)->i + 4) = uVar5;
            local_68.i = local_68.i + 1;
          }
        }
        pQVar13 = pQVar13 + 1;
      } while (pQVar13 != aend.i);
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,local_68,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005799b9:
  __stack_chk_fail();
}

Assistant:

QModelIndexList QListView::selectedIndexes() const
{
    Q_D(const QListView);
    if (!d->selectionModel)
        return QModelIndexList();

    QModelIndexList viewSelected = d->selectionModel->selectedIndexes();
    auto ignorable = [this, d](const QModelIndex &index) {
        return index.column() != d->column || index.parent() != d->root || isIndexHidden(index);
    };
    viewSelected.removeIf(ignorable);
    return viewSelected;
}